

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::GLMClassifier::ByteSizeLong(GLMClassifier *this)

{
  long lVar1;
  uint uVar2;
  Type *value;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  uint i;
  uint index;
  ulong uVar6;
  int value_00;
  
  uVar2 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = (ulong)uVar2;
  for (index = 0; uVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                      (&(this->weights_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::GLMClassifier_DoubleArray>(value);
    uVar6 = uVar6 + sVar3;
  }
  uVar4 = (ulong)(uint)(this->offset_).current_size_;
  lVar1 = uVar4 * 8;
  if (uVar4 == 0) {
    value_00 = 0;
  }
  else {
    value_00 = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value_00);
    uVar6 = uVar6 + sVar3 + 1;
  }
  this->_offset_cached_byte_size_ = value_00;
  sVar3 = uVar6 + lVar1;
  if (this->postevaluationtransform_ != 0) {
    sVar5 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->postevaluationtransform_);
    sVar3 = sVar3 + sVar5 + 1;
  }
  if (this->classencoding_ != 0) {
    sVar5 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->classencoding_);
    sVar3 = sVar3 + sVar5 + 1;
  }
  if (this->_oneof_case_[0] == 0x65) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                      ((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[0] != 100) goto LAB_00184a5b;
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>
                      ((this->ClassLabels_).stringclasslabels_);
  }
  sVar3 = sVar3 + sVar5 + 2;
LAB_00184a5b:
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t GLMClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMClassifier)
  size_t total_size = 0;

  // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
  {
    unsigned int count = this->weights_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weights(i));
    }
  }

  // repeated double offset = 2;
  {
    unsigned int count = this->offset_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _offset_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
  if (this->classencoding() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->classencoding());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}